

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void reportPresolveReductions(HighsLogOptions *log_options,HighsLp *lp,HighsLp *presolve_lp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  const_reference pvVar6;
  uint *in_RDX;
  int *in_RSI;
  HighsLogOptions *in_RDI;
  HighsInt elemdelta;
  char elemsignchar;
  HighsInt num_els_to;
  HighsInt num_row_to;
  HighsInt num_col_to;
  HighsInt num_els_from;
  HighsInt num_row_from;
  HighsInt num_col_from;
  int local_40;
  char local_39;
  int local_38;
  
  iVar1 = *in_RSI;
  iVar2 = in_RSI[1];
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x24),(long)iVar1);
  iVar3 = *pvVar6;
  uVar4 = *in_RDX;
  uVar5 = in_RDX[1];
  if (uVar4 == 0) {
    local_38 = 0;
  }
  else {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDX + 0x24),(long)(int)uVar4);
    local_38 = *pvVar6;
  }
  local_39 = '-';
  local_40 = iVar3 - local_38;
  if (iVar3 < local_38) {
    local_40 = -local_40;
    local_39 = '+';
  }
  highsLogUser(in_RDI,kInfo,
               "Presolve : Reductions: rows %d(-%d); columns %d(-%d); elements %d(%c%d)\n",
               (ulong)uVar5,(ulong)(iVar2 - uVar5),(ulong)uVar4,iVar1 - uVar4,local_38,(int)local_39
               ,local_40);
  return;
}

Assistant:

void reportPresolveReductions(const HighsLogOptions& log_options,
                              const HighsLp& lp, const HighsLp& presolve_lp) {
  HighsInt num_col_from = lp.num_col_;
  HighsInt num_row_from = lp.num_row_;
  HighsInt num_els_from = lp.a_matrix_.start_[num_col_from];
  HighsInt num_col_to = presolve_lp.num_col_;
  HighsInt num_row_to = presolve_lp.num_row_;
  HighsInt num_els_to;
  if (num_col_to) {
    num_els_to = presolve_lp.a_matrix_.start_[num_col_to];
  } else {
    num_els_to = 0;
  }
  char elemsignchar = '-';
  HighsInt elemdelta = num_els_from - num_els_to;
  if (num_els_from < num_els_to) {
    elemdelta = -elemdelta;
    elemsignchar = '+';
  }
  highsLogUser(
      log_options, HighsLogType::kInfo,
      "Presolve : Reductions: rows %" HIGHSINT_FORMAT "(-%" HIGHSINT_FORMAT
      "); columns %" HIGHSINT_FORMAT "(-%" HIGHSINT_FORMAT
      "); "
      "elements %" HIGHSINT_FORMAT "(%c%" HIGHSINT_FORMAT ")\n",
      num_row_to, (num_row_from - num_row_to), num_col_to,
      (num_col_from - num_col_to), num_els_to, elemsignchar, elemdelta);
}